

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O2

void pzshape::TPZShapeQuad::ShapeGenerating
               (TPZVec<double> *pt,TPZVec<int> *nshape,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  ulong row;
  long lVar6;
  ulong row_00;
  
  lVar6 = 4;
  while (lVar6 != 8) {
    if (nshape->fStore[lVar6 + -4] < 1) {
      lVar6 = lVar6 + 1;
    }
    else {
      row = (ulong)((uint)lVar6 & 3);
      pdVar5 = TPZFMatrix<double>::operator()(phi,row,0);
      dVar1 = *pdVar5;
      row_00 = (ulong)((uint)(lVar6 + 1) & 3);
      pdVar5 = TPZFMatrix<double>::operator()(phi,row_00,0);
      dVar2 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(phi,lVar6,0);
      *pdVar5 = dVar1 * dVar2;
      pdVar5 = TPZFMatrix<double>::operator()(dphi,0,row);
      dVar1 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(phi,row_00,0);
      dVar2 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(phi,row,0);
      dVar3 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(dphi,0,row_00);
      dVar4 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(dphi,0,lVar6);
      *pdVar5 = dVar3 * dVar4 + dVar1 * dVar2;
      pdVar5 = TPZFMatrix<double>::operator()(dphi,1,row);
      dVar1 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(phi,row_00,0);
      dVar2 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(phi,row,0);
      dVar3 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(dphi,1,row_00);
      dVar4 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(dphi,1,lVar6);
      *pdVar5 = dVar3 * dVar4 + dVar1 * dVar2;
      lVar6 = lVar6 + 1;
    }
  }
  pdVar5 = TPZFMatrix<double>::operator()(phi,0,0);
  dVar1 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()(phi,2,0);
  dVar2 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()(phi,8,0);
  *pdVar5 = dVar1 * dVar2;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,0,0);
  dVar1 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()(phi,2,0);
  dVar2 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()(phi,0,0);
  dVar3 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,0,2);
  dVar4 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,0,8);
  *pdVar5 = dVar3 * dVar4 + dVar1 * dVar2;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,1,0);
  dVar1 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()(phi,2,0);
  dVar2 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()(phi,0,0);
  dVar3 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,1,2);
  dVar4 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,1,8);
  *pdVar5 = dVar3 * dVar4 + dVar1 * dVar2;
  for (lVar6 = 4; lVar6 != 8; lVar6 = lVar6 + 1) {
    if (0 < nshape->fStore[lVar6 + -4]) {
      pdVar5 = TPZFMatrix<double>::operator()(phi,8,0);
      dVar1 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(phi,lVar6,0);
      *pdVar5 = dVar1 + *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(dphi,0,8);
      dVar1 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(dphi,0,lVar6);
      *pdVar5 = dVar1 + *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(dphi,1,8);
      dVar1 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(dphi,1,lVar6);
      *pdVar5 = dVar1 + *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(phi,lVar6,0);
      *pdVar5 = *pdVar5 * 4.0;
      pdVar5 = TPZFMatrix<double>::operator()(dphi,0,lVar6);
      *pdVar5 = *pdVar5 * 4.0;
      pdVar5 = TPZFMatrix<double>::operator()(dphi,1,lVar6);
      *pdVar5 = *pdVar5 * 4.0;
    }
  }
  pdVar5 = TPZFMatrix<double>::operator()(phi,8,0);
  *pdVar5 = *pdVar5 * 16.0;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,0,8);
  *pdVar5 = *pdVar5 * 16.0;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,1,8);
  *pdVar5 = *pdVar5 * 16.0;
  return;
}

Assistant:

void TPZShapeQuad::ShapeGenerating(const TPZVec<REAL> &pt, TPZVec<int> &nshape, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
    {
        int is;
        for(is=4; is<8; is++)
        {
            if(nshape[is-NCornerNodes] < 1) continue;
            phi(is,0) = phi(is%4,0)*phi((is+1)%4,0);
            dphi(0,is) = dphi(0,is%4)*phi((is+1)%4,0)+phi(is%4,0)*dphi(0,(is+1)%4);
            dphi(1,is) = dphi(1,is%4)*phi((is+1)%4,0)+phi(is%4,0)*dphi(1,(is+1)%4);
        }
        phi(8,0) = phi(0,0)*phi(2,0);
        dphi(0,8) = dphi(0,0)*phi(2,0)+phi(0,0)*dphi(0,2);
        dphi(1,8) = dphi(1,0)*phi(2,0)+phi(0,0)*dphi(1,2);

        // Make the generating shape functions linear and unitary
        for(is=4; is<8; is++)
        {
            if(nshape[is-NCornerNodes] < 1) continue;
            phi(is,0) += phi(8,0);
            dphi(0,is) += dphi(0,8);
            dphi(1,is) += dphi(1,8);
            phi(is,0) *= 4.;
            dphi(0,is) *= 4.;
            dphi(1,is) *= 4.;
        }
        phi(8,0) *= 16.;
        dphi(0,8) *= 16.;
        dphi(1,8) *= 16.;
    }